

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O2

void __thiscall
chrono::ChLoaderGravity::ChLoaderGravity
          (ChLoaderGravity *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  undefined1 auVar1 [16];
  __shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
  ChLoaderUVWdistributed::ChLoaderUVWdistributed
            (&this->super_ChLoaderUVWdistributed,(shared_ptr<chrono::ChLoadableUVW> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  auVar1 = vmovhps_avx(ZEXT816(0) << 0x40,0xc02399999999999a);
  (this->super_ChLoaderUVWdistributed).super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00145fc8;
  *(undefined1 (*) [16])(this->G_acc).m_data = auVar1;
  (this->G_acc).m_data[2] = 0.0;
  this->num_int_points = 1;
  return;
}

Assistant:

ChLoaderGravity(std::shared_ptr<ChLoadableUVW> mloadable)
        : ChLoaderUVWdistributed(mloadable), G_acc(0, -9.8, 0), num_int_points(1){}